

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

mat3 * dja::mat3::scale(vec3 *values)

{
  float_t fVar1;
  float_t fVar2;
  float_t fVar3;
  mat3 *in_RDI;
  
  fVar1 = values->x;
  fVar2 = values->y;
  fVar3 = values->z;
  in_RDI->m[0].x = 0.0;
  in_RDI->m[0].y = 0.0;
  *(undefined8 *)&in_RDI->m[0].z = 0;
  in_RDI->m[1].y = 0.0;
  in_RDI->m[1].z = 0.0;
  in_RDI->m[2].x = 0.0;
  in_RDI->m[2].y = 0.0;
  in_RDI->m[0].x = fVar1;
  in_RDI->m[0].y = 0.0;
  in_RDI->m[0].z = 0.0;
  in_RDI->m[1].x = 0.0;
  in_RDI->m[1].y = fVar2;
  *(undefined8 *)&in_RDI->m[1].z = 0;
  in_RDI->m[2].y = 0.0;
  in_RDI->m[2].z = fVar3;
  return in_RDI;
}

Assistant:

mat3 mat3::scale(const vec3& values)
{
    return mat3(values[0], 0, 0,
                0, values[1], 0,
                0, 0, values[2]);
}